

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O3

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column>
::
construct<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column_const&,unsigned_int,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Column_zp_settings*&>
          (Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Column>
           *this,Column *u,uint *u_1,
          map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>_>_>_>
          **u_2,Column_zp_settings **u_3)

{
  pointer this_00;
  void *ret;
  
  this_00 = *(pointer *)this;
  if (this_00 == (pointer)0x0) {
    this_00 = (pointer)boost::pool<boost::default_user_allocator_malloc_free>::malloc_need_resize
                                 ((pool<boost::default_user_allocator_malloc_free> *)this);
    if (this_00 == (pointer)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                    ,0x33,
                    "pointer Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>>::Column>::construct(U &&...) [T = Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>>::Column, U = <const Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>>::Column &, unsigned int, std::map<unsigned int, std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>>, Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>::RowEntryComp>> *&, Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>::Column_zp_settings *&>]"
                   );
    }
  }
  else {
    *(undefined8 *)this = *(undefined8 *)&(this_00->super_Column).super_Row_access_option;
  }
  persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
  ::
  Intrusive_list_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>>>>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              *)this_00,&u->super_Column,*u_1,*u_2,*u_3);
  return this_00;
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }